

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayout.cpp
# Opt level: O2

void __thiscall myvk::PipelineLayout::~PipelineLayout(PipelineLayout *this)

{
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)&PTR__PipelineLayout_003228f8
  ;
  if (this->m_pipeline_layout != (VkPipelineLayout)0x0) {
    (*vkDestroyPipelineLayout)
              (((this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_device,this->m_pipeline_layout,(VkAllocationCallbacks *)0x0);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector(&this->m_descriptor_layout_ptrs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
              _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

PipelineLayout::~PipelineLayout() {
	if (m_pipeline_layout)
		vkDestroyPipelineLayout(m_device_ptr->GetHandle(), m_pipeline_layout, nullptr);
}